

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O3

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  undefined4 unaff_EBP;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int _h;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  Mat local_b8;
  uint local_6c;
  Option *local_68;
  long local_60;
  void *local_58;
  Mat *local_50;
  uint local_44;
  Mat *local_40;
  ulong local_38;
  
  uVar1 = bottom_blob->dims;
  pvVar2 = (this->axes).data;
  if ((pvVar2 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    auVar17._0_4_ = -(uint)(this->expand_w == 0);
    auVar17._4_4_ = -(uint)(this->expand_h == 0);
    auVar17._8_4_ = -(uint)(this->expand_d == 0);
    auVar17._12_4_ = -(uint)(this->expand_c == 0);
    uVar9 = movmskps(unaff_EBP,auVar17);
    uVar10 = uVar9 ^ 0xf;
    bVar13 = (byte)uVar10;
    bVar8 = (bVar13 & 2) >> 1;
    uVar12 = (ulong)CONCAT31((int3)(uVar9 >> 8),bVar13) & 0xffffffffffffff04;
    uVar12 = CONCAT71((int7)(uVar12 >> 8),(byte)uVar12 >> 2);
    bVar13 = bVar13 >> 3;
  }
  else {
    lVar7 = (long)(this->axes).w;
    if (lVar7 < 1) {
      uVar10 = 0;
      bVar8 = 0;
      uVar12 = 0;
      bVar13 = 0;
    }
    else {
      local_6c = uVar1 + 1;
      local_44 = uVar1 & 0xfffffffe;
      lVar11 = 0;
      bVar13 = 0;
      uVar12 = 0;
      bVar8 = 0;
      uVar10 = 0;
      do {
        bVar15 = uVar1 == 3;
        iVar14 = *(int *)((long)pvVar2 + lVar11 * 4);
        iVar14 = (iVar14 >> 0x1f & local_6c) + iVar14;
        bVar16 = iVar14 == 1;
        bVar13 = bVar13 | (local_44 == 2 && iVar14 == 0);
        uVar12 = (ulong)(byte)((byte)uVar12 | (bVar16 && bVar15));
        bVar8 = (uVar1 == 1 && iVar14 == 0) | bVar8 |
                (iVar14 == 2 && bVar15 || uVar1 == 2 && bVar16);
        uVar10 = (uint)(byte)((uVar1 == 1 && bVar16) | (byte)uVar10 |
                             (iVar14 == 3 && bVar15 || uVar1 == 2 && iVar14 == 2));
        lVar11 = lVar11 + 1;
        local_60 = lVar7;
        local_58 = pvVar2;
        local_38 = (ulong)uVar1;
      } while (lVar7 != lVar11);
    }
  }
  iVar14 = bottom_blob->w;
  _h = bottom_blob->h;
  uVar9 = bottom_blob->c;
  local_68 = opt;
  local_50 = bottom_blob;
  local_40 = top_blob;
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data == (void *)0x0) goto LAB_00411f40;
          local_58 = (void *)CONCAT44(local_58._4_4_,(int)uVar12);
          local_60 = CONCAT44(local_60._4_4_,_h);
          local_6c = uVar9;
          free(top_blob->data);
        }
        else {
          local_58 = (void *)CONCAT44(local_58._4_4_,(int)uVar12);
          local_60 = CONCAT44(local_60._4_4_,_h);
          local_6c = uVar9;
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
        uVar12 = (ulong)local_58 & 0xffffffff;
        _h = (int)local_60;
        uVar9 = local_6c;
      }
    }
LAB_00411f40:
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = local_50->refcount;
    top_blob->data = local_50->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = local_50->elemsize;
    top_blob->elempack = local_50->elempack;
    top_blob->allocator = local_50->allocator;
    iVar4 = local_50->w;
    iVar5 = local_50->h;
    iVar6 = local_50->d;
    top_blob->dims = local_50->dims;
    top_blob->w = iVar4;
    top_blob->h = iVar5;
    top_blob->d = iVar6;
    top_blob->c = local_50->c;
    top_blob->cstep = local_50->cstep;
  }
  if (uVar1 == 3) {
    if ((uVar10 & 1) == 0) {
      if (bVar8 == 0) {
        if ((uVar12 & 1) == 0) {
          if ((bVar13 & 1) == 0) goto LAB_0041296b;
          Mat::reshape(&local_b8,local_50,iVar14,_h,uVar9,1,local_68->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto LAB_0041296b;
          if (local_b8.allocator != (Allocator *)0x0) {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
            goto LAB_0041296b;
          }
        }
        else {
          Mat::reshape(&local_b8,local_50,iVar14,_h,1,uVar9,local_68->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto LAB_0041296b;
          if (local_b8.allocator != (Allocator *)0x0) {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
            goto LAB_0041296b;
          }
        }
      }
      else {
        Mat::reshape(&local_b8,local_50,iVar14,1,_h,uVar9,local_68->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto LAB_0041296b;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto LAB_0041296b;
        }
      }
    }
    else {
      Mat::reshape(&local_b8,local_50,1,iVar14,_h,uVar9,local_68->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto LAB_0041296b;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto LAB_0041296b;
      }
    }
  }
  else if (uVar1 == 2) {
    if ((uVar10 & 1) == 0) {
      if (bVar8 == 0) {
        if ((bVar13 & 1) == 0) goto LAB_0041296b;
        Mat::reshape(&local_b8,local_50,iVar14,_h,1,local_68->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto LAB_0041296b;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto LAB_0041296b;
        }
      }
      else {
        Mat::reshape(&local_b8,local_50,iVar14,1,_h,local_68->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto LAB_0041296b;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto LAB_0041296b;
        }
      }
    }
    else {
      Mat::reshape(&local_b8,local_50,1,iVar14,_h,local_68->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto LAB_0041296b;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto LAB_0041296b;
      }
    }
  }
  else {
    if (uVar1 != 1) goto LAB_0041296b;
    if (((byte)uVar10 & bVar8) == 0) {
      if ((uVar10 & 1) == 0) {
        if (bVar8 == 0) goto LAB_0041296b;
        Mat::reshape(&local_b8,local_50,iVar14,1,local_68->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto LAB_0041296b;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto LAB_0041296b;
        }
      }
      else {
        Mat::reshape(&local_b8,local_50,1,iVar14,local_68->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto LAB_0041296b;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto LAB_0041296b;
        }
      }
    }
    else {
      Mat::reshape(&local_b8,local_50,1,iVar14,1,local_68->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto LAB_0041296b;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto LAB_0041296b;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto LAB_0041296b;
      }
    }
  }
  if (local_b8.data != (void *)0x0) {
    free(local_b8.data);
  }
LAB_0041296b:
  if ((top_blob->data == (void *)0x0) || (iVar14 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar14 = -100;
  }
  return iVar14;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_d = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_d = expand_d;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
            if (dims == 3 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 3 && axis == 1)
            {
                _expand_d = true;
            }
            if (dims == 3 && axis == 2)
            {
                _expand_h = true;
            }
            if (dims == 3 && axis == 3)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, channels, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, channels, opt.blob_allocator);
        }
        else if (_expand_d)
        {
            top_blob = bottom_blob.reshape(w, h, 1, channels, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, channels, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}